

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

EDLines * __thiscall EDLines::drawOnImage(EDLines *this)

{
  long lVar1;
  int *in_RSI;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  _InputArray local_70;
  undefined8 local_58;
  EDLines *pEStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar2 = *(void **)(in_RSI + 2);
  cv::Mat::Mat((Mat *)this,in_RSI[1],*in_RSI,0,pvVar2,0);
  local_48 = 0;
  local_58 = CONCAT44(local_58._4_4_,0x1010000);
  local_70.sz.width = 0;
  local_70.sz.height = 0;
  local_70.flags = 0x2010000;
  local_70.obj = this;
  pEStack_50 = this;
  cv::cvtColor((cv *)&local_58,&local_70,(_OutputArray *)0x8,0,(int)pvVar2);
  if (0 < in_RSI[0x9c]) {
    lVar4 = 0x18;
    lVar3 = 0;
    do {
      local_70.sz.width = 0;
      local_70.sz.height = 0;
      local_70.flags = 0x3010000;
      lVar1 = *(long *)(in_RSI + 0x96);
      local_78 = (int)ROUND(*(double *)(lVar1 + -0x18 + lVar4));
      local_74 = (int)ROUND(*(double *)(lVar1 + -0x10 + lVar4));
      local_80 = (int)ROUND(*(double *)(lVar1 + -8 + lVar4));
      local_7c = (int)ROUND(*(double *)(lVar1 + lVar4));
      local_58 = 0;
      pEStack_50 = (EDLines *)0x406fe00000000000;
      local_48 = 0;
      uStack_40 = 0;
      local_70.obj = this;
      cv::line(&local_70,&local_78,&local_80,&local_58,1,0x10,0);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < in_RSI[0x9c]);
  }
  return this;
}

Assistant:

Mat EDLines::drawOnImage()
{
	Mat colorImage = Mat(height, width, CV_8UC1, srcImg);
	cvtColor(colorImage, colorImage, COLOR_GRAY2BGR);
	for (int i = 0; i < linesNo; i++) {
		line(colorImage, linePoints[i].start, linePoints[i].end, Scalar(0, 255, 0), 1, LINE_AA, 0); // draw lines as green on image
	}

	return colorImage;
}